

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

int pair1_pipe_start(void *arg)

{
  pair1_sock *s_00;
  uint16_t uVar1;
  pair1_sock *s;
  pair1_pipe *p;
  void *arg_local;
  
  s_00 = *(pair1_sock **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x11) {
    nni_mtx_lock(&s_00->mtx);
    if (s_00->p == (pair1_pipe *)0x0) {
      s_00->p = (pair1_pipe *)arg;
      s_00->rd_ready = false;
      nni_mtx_unlock(&s_00->mtx);
      pair1_send_sched(s_00);
      nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x1d8));
      arg_local._4_4_ = 0;
    }
    else {
      nni_mtx_unlock(&s_00->mtx);
      uVar1 = nni_pipe_peer(*arg);
      nng_log_warn("NNG-PAIR-BUSY","Peer pipe protocol %d is already paired, rejected.",(ulong)uVar1
                  );
      nni_stat_inc(&s_00->stat_reject_already,1);
      arg_local._4_4_ = 4;
    }
  }
  else {
    nni_stat_inc(&s_00->stat_reject_mismatch,1);
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x11
                );
    arg_local._4_4_ = 0xd;
  }
  return arg_local._4_4_;
}

Assistant:

static int
pair1_pipe_start(void *arg)
{
	pair1_pipe *p = arg;
	pair1_sock *s = p->pair;

	if (nni_pipe_peer(p->pipe) != PAIR1_PEER) {
		BUMP_STAT(&s->stat_reject_mismatch);
		// Peer protocol mismatch.
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), PAIR1_PEER);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->mtx);
	if (s->p != NULL) {
		nni_mtx_unlock(&s->mtx);
		nng_log_warn("NNG-PAIR-BUSY",
		    "Peer pipe protocol %d is already paired, rejected.",
		    nni_pipe_peer(p->pipe));
		BUMP_STAT(&s->stat_reject_already);
		return (NNG_EBUSY);
	}
	s->p        = p;
	s->rd_ready = false;
	nni_mtx_unlock(&s->mtx);

	pair1_send_sched(s);

	// And the pipe read of course.
	nni_pipe_recv(p->pipe, &p->aio_recv);

	return (0);
}